

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXBigInteger.cpp
# Opt level: O2

Block ZXing::GetShiftedBlock(Magnitude *num,size_t x,size_t y)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  
  puVar1 = (num->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (y == 0 || x == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = puVar1[x - 1] >> (-(byte)y & 0x3f);
  }
  if ((long)(num->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 >> 3 == x) {
    uVar2 = 0;
  }
  else {
    uVar2 = puVar1[x] << ((byte)y & 0x3f);
  }
  return uVar2 | uVar3;
}

Assistant:

static Block GetShiftedBlock(const Magnitude& num, size_t x, size_t y)
{
	Block part1 = (x == 0 || y == 0) ? Block(0) : (num[x - 1] >> (NB_BITS - y));
	Block part2 = (x == num.size()) ? Block(0) : (num[x] << y);
	return part1 | part2;
}